

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateNoCompression(ucvector *out,uchar *data,size_t datasize)

{
  ulong uVar1;
  ulong in_RDX;
  undefined1 uVar2;
  uchar firstbyte;
  uint NLEN;
  uint LEN;
  uint BTYPE;
  uint BFINAL;
  uint datapos;
  size_t numdeflateblocks;
  size_t j;
  size_t i;
  undefined2 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffba;
  int in_stack_ffffffffffffffbc;
  int local_40;
  uint local_34;
  ulong local_28;
  ulong local_20;
  
  uVar1 = (in_RDX + 0xfffe) / 0xffff;
  local_34 = 0;
  for (local_20 = 0; local_20 != uVar1; local_20 = local_20 + 1) {
    uVar2 = local_20 == uVar1 - 1;
    ucvector_push_back((ucvector *)
                       CONCAT44(in_stack_ffffffffffffffbc,
                                CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                        in_stack_ffffffffffffffb8))),'\0');
    local_40 = 0xffff;
    if (in_RDX - local_34 < 0xffff) {
      local_40 = (int)in_RDX - local_34;
    }
    in_stack_ffffffffffffffbc = 0xffff - local_40;
    ucvector_push_back((ucvector *)
                       CONCAT44(in_stack_ffffffffffffffbc,
                                CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                        in_stack_ffffffffffffffb8))),'\0');
    ucvector_push_back((ucvector *)
                       CONCAT44(in_stack_ffffffffffffffbc,
                                CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                        in_stack_ffffffffffffffb8))),'\0');
    ucvector_push_back((ucvector *)
                       CONCAT44(in_stack_ffffffffffffffbc,
                                CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                        in_stack_ffffffffffffffb8))),'\0');
    ucvector_push_back((ucvector *)
                       CONCAT44(in_stack_ffffffffffffffbc,
                                CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                        in_stack_ffffffffffffffb8))),'\0');
    for (local_28 = 0; in_stack_ffffffffffffffba = local_28 < 0xffff && local_34 < in_RDX,
        local_28 < 0xffff && local_34 < in_RDX; local_28 = local_28 + 1) {
      local_34 = local_34 + 1;
      ucvector_push_back((ucvector *)
                         CONCAT44(in_stack_ffffffffffffffbc,
                                  CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffba,
                                                          in_stack_ffffffffffffffb8))),'\0');
    }
  }
  return 0;
}

Assistant:

static unsigned deflateNoCompression(ucvector* out, const unsigned char* data, size_t datasize)
{
	/*non compressed deflate block data: 1 bit BFINAL,2 bits BTYPE,(5 bits): it jumps to start of next byte,
	2 bytes LEN, 2 bytes NLEN, LEN bytes literal DATA*/

	size_t i, j, numdeflateblocks = (datasize + 65534) / 65535;
	unsigned datapos = 0;
	for (i = 0; i != numdeflateblocks; ++i)
	{
		unsigned BFINAL, BTYPE, LEN, NLEN;
		unsigned char firstbyte;

		BFINAL = (i == numdeflateblocks - 1);
		BTYPE = 0;

		firstbyte = (unsigned char)(BFINAL + ((BTYPE & 1) << 1) + ((BTYPE & 2) << 1));
		ucvector_push_back(out, firstbyte);

		LEN = 65535;
		if (datasize - datapos < 65535) LEN = (unsigned)datasize - datapos;
		NLEN = 65535 - LEN;

		ucvector_push_back(out, (unsigned char)(LEN & 255));
		ucvector_push_back(out, (unsigned char)(LEN >> 8));
		ucvector_push_back(out, (unsigned char)(NLEN & 255));
		ucvector_push_back(out, (unsigned char)(NLEN >> 8));

		/*Decompressed data*/
		for (j = 0; j < 65535 && datapos < datasize; ++j)
		{
			ucvector_push_back(out, data[datapos++]);
		}
	}

	return 0;
}